

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerTest.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_31d0::LexerTest_variableStrings_Test::~LexerTest_variableStrings_Test
          (LexerTest_variableStrings_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LexerTest, variableStrings) {
  StringRef input = "\
this is one string\n\
this string crosses a $\nnewline\n\
:\n\
|\n";
  ninja::Lexer lexer(input);
  ninja::Token tok;

  // Put the lexer into "variable" string mode.
  lexer.setMode(ninja::Lexer::LexingMode::VariableString);

  // Check we consume spaces in strings.
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::String, tok.tokenKind);
  EXPECT_EQ(std::string("String"), tok.getKindName());
  EXPECT_EQ(0, memcmp(tok.start, "this is one string", tok.length));
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::Newline, tok.tokenKind);

  // Check that we honor the newline escape.
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::String, tok.tokenKind);
  EXPECT_EQ(0, memcmp(tok.start, "this string crosses a $\nnewline",
                      tok.length));
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::Newline, tok.tokenKind);

  // Check that we respect special characters at the start of the token.
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::String, tok.tokenKind);
  EXPECT_EQ(0, memcmp(tok.start, ":", tok.length));
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::Newline, tok.tokenKind);

  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::String, tok.tokenKind);
  EXPECT_EQ(0, memcmp(tok.start, "|", tok.length));
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::Newline, tok.tokenKind);

  // Check final token.
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::EndOfFile, tok.tokenKind);
}